

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Shuffling.cpp
# Opt level: O0

void Shell::Shuffling::shuffle(Unit *unit)

{
  bool bVar1;
  FormulaUnit *in_RDI;
  Formula *in_stack_00000010;
  
  bVar1 = Kernel::Unit::isClause(&in_RDI->super_Unit);
  if (bVar1) {
    Kernel::Unit::asClause(&in_RDI->super_Unit);
    shuffle((Clause *)unit);
  }
  else {
    Kernel::FormulaUnit::formula(in_RDI);
    shuffle(in_stack_00000010);
  }
  return;
}

Assistant:

void Shuffling::shuffle(Unit* unit)
{
  // cout << "Bef: " << unit->toString() << std::endl;

  if (unit->isClause()) {
    shuffle(unit->asClause());
  } else {
    shuffle(static_cast<FormulaUnit*>(unit)->formula());
  }

  // cout << "Aft: " << unit->toString() << std::endl;
}